

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::MultipleFieldsMapKeyComparator::IsMatchInternal
          (MultipleFieldsMapKeyComparator *this,Message *message1,Message *message2,int unpacked_any
          ,vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           *parent_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *key_field_path,int path_index)

{
  FieldDescriptor *field;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Message *message1_00;
  Message *message2_00;
  Nonnull<const_char_*> failure_msg;
  long lVar4;
  SpecificField *pSVar5;
  pointer pSVar6;
  byte bVar7;
  Metadata MVar8;
  Metadata MVar9;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  SpecificField specific_field;
  
  bVar7 = 0;
  field = (key_field_path->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start[path_index];
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector(&current_parent_fields,parent_fields);
  if (((long)(key_field_path->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(key_field_path->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) + -1 == (long)path_index) {
    if ((field->type_ == '\v') && (bVar1 = FieldDescriptor::is_map_message_type(field), bVar1)) {
      bVar1 = CompareMapField(this->message_differencer_,message1,message2,unpacked_any,field,
                              &current_parent_fields);
    }
    else {
      bVar7 = field->field_0x1;
      bVar1 = (bool)((bVar7 & 0x20) >> 5);
      if (0xbf < bVar7 == bVar1) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar1,0xbf < bVar7,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&specific_field,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&specific_field);
      }
      if ((field->field_0x1 & 0x20) == 0) {
        bVar1 = CompareFieldValueUsingParentFields
                          (this->message_differencer_,message1,message2,unpacked_any,field,-1,-1,
                           &current_parent_fields);
      }
      else {
        bVar1 = CompareRepeatedField
                          (this->message_differencer_,message1,message2,unpacked_any,field,
                           &current_parent_fields);
      }
    }
  }
  else {
    MVar8 = Message::GetMetadata(message1);
    MVar9 = Message::GetMetadata(message2);
    bVar2 = Reflection::HasField(MVar8.reflection,message1,field);
    bVar3 = Reflection::HasField(MVar9.reflection,message2,field);
    bVar1 = true;
    if (bVar2 || bVar3) {
      if (bVar2 == bVar3) {
        specific_field.unknown_field_number = -1;
        specific_field.unknown_field_type = TYPE_VARINT;
        specific_field.index = -1;
        specific_field.new_index = -1;
        specific_field.map_entry1 = (Message *)0x0;
        specific_field.map_entry2 = (Message *)0x0;
        specific_field.unknown_field_set1 = (UnknownFieldSet *)0x0;
        specific_field.unknown_field_set2 = (UnknownFieldSet *)0x0;
        specific_field.unknown_field_index1 = -1;
        specific_field.unknown_field_index2 = -1;
        specific_field.forced_compare_no_presence_ = false;
        specific_field.message1 = message1;
        specific_field.message2 = message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field;
        if (current_parent_fields.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            current_parent_fields.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
          ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                    ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                      *)&current_parent_fields,
                     (iterator)
                     current_parent_fields.
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&specific_field);
        }
        else {
          pSVar5 = &specific_field;
          pSVar6 = current_parent_fields.
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
            pSVar6->message1 = pSVar5->message1;
            pSVar5 = (SpecificField *)((long)pSVar5 + (ulong)bVar7 * -0x10 + 8);
            pSVar6 = (pointer)((long)pSVar6 + (ulong)bVar7 * -0x10 + 8);
          }
          current_parent_fields.
          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               current_parent_fields.
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        message1_00 = Reflection::GetMessage(MVar8.reflection,message1,field,(MessageFactory *)0x0);
        message2_00 = Reflection::GetMessage(MVar9.reflection,message2,field,(MessageFactory *)0x0);
        bVar1 = IsMatchInternal(this,message1_00,message2_00,0,&current_parent_fields,key_field_path
                                ,path_index + 1);
      }
      else {
        bVar1 = false;
      }
    }
  }
  if (current_parent_fields.
      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(current_parent_fields.
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)current_parent_fields.
                          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)current_parent_fields.
                          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool IsMatchInternal(
      const Message& message1, const Message& message2, int unpacked_any,
      const std::vector<SpecificField>& parent_fields,
      const std::vector<const FieldDescriptor*>& key_field_path,
      int path_index) const {
    const FieldDescriptor* field = key_field_path[path_index];
    std::vector<SpecificField> current_parent_fields(parent_fields);
    if (path_index == static_cast<int64_t>(key_field_path.size() - 1)) {
      if (field->is_map()) {
        return message_differencer_->CompareMapField(
            message1, message2, unpacked_any, field, &current_parent_fields);
      } else if (field->is_repeated()) {
        return message_differencer_->CompareRepeatedField(
            message1, message2, unpacked_any, field, &current_parent_fields);
      } else {
        return message_differencer_->CompareFieldValueUsingParentFields(
            message1, message2, unpacked_any, field, -1, -1,
            &current_parent_fields);
      }
    } else {
      const Reflection* reflection1 = message1.GetReflection();
      const Reflection* reflection2 = message2.GetReflection();
      bool has_field1 = reflection1->HasField(message1, field);
      bool has_field2 = reflection2->HasField(message2, field);
      if (!has_field1 && !has_field2) {
        return true;
      }
      if (has_field1 != has_field2) {
        return false;
      }
      SpecificField specific_field;
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      current_parent_fields.push_back(specific_field);
      return IsMatchInternal(reflection1->GetMessage(message1, field),
                             reflection2->GetMessage(message2, field),
                             false /*key is never Any*/, current_parent_fields,
                             key_field_path, path_index + 1);
    }
  }